

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O2

void av1_alloc_restoration_buffers(AV1_COMMON *cm,_Bool is_sgr_enabled)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int32_t *piVar5;
  RestorationLineBuffers *pRVar6;
  void *pvVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar1 = cm->seq_params->monochrome;
  if (cm->rst_tmpbuf == (int32_t *)0x0 && is_sgr_enabled) {
    piVar5 = (int32_t *)aom_memalign(0x10,0x13b9a0);
    cm->rst_tmpbuf = piVar5;
    if (piVar5 == (int32_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->rst_tmpbuf");
    }
  }
  if (cm->rlbs == (RestorationLineBuffers *)0x0) {
    pRVar6 = (RestorationLineBuffers *)aom_malloc(0x1260);
    cm->rlbs = pRVar6;
    if (pRVar6 == (RestorationLineBuffers *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->rlbs");
    }
  }
  iVar3 = cm->superres_upscaled_width;
  iVar4 = (cm->mi_params).mi_rows;
  bVar2 = cm->seq_params->use_highbitdepth;
  for (uVar10 = 0; ((ulong)(uVar1 == '\0') << 7 | 0x40) != uVar10; uVar10 = uVar10 + 0x40) {
    if (uVar10 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (uint)(cm->seq_params->subsampling_x != 0);
    }
    uVar9 = ((int)(uVar9 + iVar3) >> (sbyte)uVar9) + 0x27U & 0xffffffe0;
    iVar8 = ((iVar4 * 4 + 0x47) / 0x40) * 2 * uVar9 << (bVar2 & 0x1f);
    pvVar7 = *(void **)((long)&cm->rst_info[0].boundaries.stripe_boundary_above + uVar10);
    if (((iVar8 != *(int *)((long)&cm->rst_info[0].boundaries.stripe_boundary_size + uVar10)) ||
        (pvVar7 == (void *)0x0)) ||
       (*(long *)((long)&cm->rst_info[0].boundaries.stripe_boundary_below + uVar10) == 0)) {
      aom_free(pvVar7);
      aom_free(*(void **)((long)&cm->rst_info[0].boundaries.stripe_boundary_below + uVar10));
      pvVar7 = aom_memalign(0x20,(long)iVar8);
      *(void **)((long)&cm->rst_info[0].boundaries.stripe_boundary_above + uVar10) = pvVar7;
      if (pvVar7 == (void *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate boundaries->stripe_boundary_above");
      }
      pvVar7 = aom_memalign(0x20,(long)iVar8);
      *(void **)((long)&cm->rst_info[0].boundaries.stripe_boundary_below + uVar10) = pvVar7;
      if (pvVar7 == (void *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate boundaries->stripe_boundary_below");
      }
      *(int *)((long)&cm->rst_info[0].boundaries.stripe_boundary_size + uVar10) = iVar8;
    }
    *(uint *)((long)&cm->rst_info[0].boundaries.stripe_boundary_stride + uVar10) = uVar9;
  }
  return;
}

Assistant:

void av1_alloc_restoration_buffers(AV1_COMMON *cm, bool is_sgr_enabled) {
  const int num_planes = av1_num_planes(cm);

  if (cm->rst_tmpbuf == NULL && is_sgr_enabled) {
    CHECK_MEM_ERROR(cm, cm->rst_tmpbuf,
                    (int32_t *)aom_memalign(16, RESTORATION_TMPBUF_SIZE));
  }

  if (cm->rlbs == NULL) {
    CHECK_MEM_ERROR(cm, cm->rlbs, aom_malloc(sizeof(RestorationLineBuffers)));
  }

  // For striped loop restoration, we divide each plane into "stripes",
  // of height 64 luma pixels but with an offset by RESTORATION_UNIT_OFFSET
  // luma pixels to match the output from CDEF. We will need to store 2 *
  // RESTORATION_CTX_VERT lines of data for each stripe.
  int mi_h = cm->mi_params.mi_rows;
  const int ext_h = RESTORATION_UNIT_OFFSET + (mi_h << MI_SIZE_LOG2);
  const int num_stripes = (ext_h + 63) / 64;

  // Now we need to allocate enough space to store the line buffers for the
  // stripes
  const int frame_w = cm->superres_upscaled_width;
  const int use_highbd = cm->seq_params->use_highbitdepth;

  for (int p = 0; p < num_planes; ++p) {
    const int is_uv = p > 0;
    const int ss_x = is_uv && cm->seq_params->subsampling_x;
    const int plane_w = ((frame_w + ss_x) >> ss_x) + 2 * RESTORATION_EXTRA_HORZ;
    const int stride = ALIGN_POWER_OF_TWO(plane_w, 5);
    const int buf_size = num_stripes * stride * RESTORATION_CTX_VERT
                         << use_highbd;
    RestorationStripeBoundaries *boundaries = &cm->rst_info[p].boundaries;

    if (buf_size != boundaries->stripe_boundary_size ||
        boundaries->stripe_boundary_above == NULL ||
        boundaries->stripe_boundary_below == NULL) {
      aom_free(boundaries->stripe_boundary_above);
      aom_free(boundaries->stripe_boundary_below);

      CHECK_MEM_ERROR(cm, boundaries->stripe_boundary_above,
                      (uint8_t *)aom_memalign(32, buf_size));
      CHECK_MEM_ERROR(cm, boundaries->stripe_boundary_below,
                      (uint8_t *)aom_memalign(32, buf_size));

      boundaries->stripe_boundary_size = buf_size;
    }
    boundaries->stripe_boundary_stride = stride;
  }
}